

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall
adios2::core::Engine::Engine
          (Engine *this,string *engineType,IO *io,string *name,Mode openMode,Comm *comm,char *md,
          size_t mdsize)

{
  UserOptions *pUVar1;
  HostOptions *pHVar2;
  string *in_RCX;
  undefined8 *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  string *in_stack_00000048;
  Engine *in_stack_00000050;
  Comm *in_stack_ffffffffffffff38;
  Comm *in_stack_ffffffffffffff40;
  allocator local_61;
  string local_60 [60];
  undefined4 local_24;
  string *local_20;
  undefined8 *local_18;
  
  *in_RDI = &PTR__Engine_0112b418;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  in_RDI[5] = local_18;
  std::__cxx11::string::string((string *)(in_RDI + 6),local_20);
  *(undefined4 *)(in_RDI + 10) = local_24;
  helper::Comm::Comm(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pUVar1 = ADIOS::GetUserOptions((ADIOS *)*local_18);
  in_RDI[0xc] = pUVar1;
  pHVar2 = ADIOS::GetHostOptions_abi_cxx11_((ADIOS *)*local_18);
  in_RDI[0xd] = pHVar2;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0x74) = 0;
  in_RDI[0xf] = 0;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x81) = 1;
  *(undefined1 *)((long)in_RDI + 0x82) = 0;
  *(undefined1 *)((long)in_RDI + 0x83) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  std::
  unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
  ::unordered_set((unordered_set<const_adios2::core::VariableBase_*,_std::hash<const_adios2::core::VariableBase_*>,_std::equal_to<const_adios2::core::VariableBase_*>,_std::allocator<const_adios2::core::VariableBase_*>_>
                   *)0x84c6b2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Engine with metadata in memory",&local_61);
  ThrowUp(in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

Engine::Engine(const std::string engineType, IO &io, const std::string &name, const Mode openMode,
               helper::Comm comm, const char *md, const size_t mdsize)
: m_EngineType(engineType), m_IO(io), m_Name(name), m_OpenMode(openMode), m_Comm(std::move(comm)),
  m_UserOptions(io.m_ADIOS.GetUserOptions()), m_HostOptions(io.m_ADIOS.GetHostOptions())
{
    ThrowUp("Engine with metadata in memory");
}